

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TType::TType(TType *this,TPublicType *p)

{
  undefined1 *puVar1;
  TBasicType TVar2;
  char *__s;
  TArraySizes *pTVar3;
  TVector<glslang::TArraySize> *pTVar4;
  TTypeParameters *pTVar5;
  TSpirvType *pTVar6;
  TSampler TVar7;
  int iVar8;
  uint uVar9;
  TPoolAllocator *in_RAX;
  undefined4 extraout_var;
  TPoolAllocator *this_00;
  TString *this_01;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 uVar18;
  TQualifier *pTVar19;
  TQualifier *pTVar20;
  TType *pTVar21;
  pool_allocator<char> local_28;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_00b08c38;
  uVar9 = *(uint *)&this->field_0x8;
  uVar17 = (uint)(byte)(char)p->basicType;
  *(uint *)&this->field_0x8 = uVar9 & 0xffffff00 | uVar17;
  uVar12 = (*(uint *)&p->field_0xb8 & 0xf) << 8;
  *(uint *)&this->field_0x8 = uVar9 & 0xfffff000 | uVar17 | uVar12;
  uVar13 = (*(uint *)&p->field_0xb8 & 0xf0) << 8;
  *(uint *)&this->field_0x8 = uVar9 & 0xffff0000 | uVar17 | uVar12 | uVar13;
  uVar14 = (*(uint *)&p->field_0xb8 & 0xf00) << 8;
  *(uint *)&this->field_0x8 = uVar9 & 0xffe00000 | uVar17 | uVar12 | uVar13 | uVar14;
  uVar15 = (*(uint *)&p->field_0xb8 & 0x1000) << 9;
  *(uint *)&this->field_0x8 = uVar9 & 0xffc00000 | uVar17 | uVar12 | uVar13 | uVar14 | uVar15;
  uVar16 = (*(uint *)&p->field_0xb8 & 0x2000) << 9;
  *(uint *)&this->field_0x8 =
       uVar16 | uVar9 & 0xf8000000 | uVar17 | uVar12 | uVar13 | uVar14 | uVar15;
  uVar10 = (*(uint *)&p->field_0xb8 & 0x4000) << 0xd;
  *(uint *)&this->field_0x8 =
       uVar16 | uVar9 & 0xf0000000 | uVar17 | uVar12 | uVar13 | uVar14 | uVar15 | uVar10;
  this->arraySizes = p->arraySizes;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->typeParameters = p->typeParameters;
  this->spirvType = p->spirvType;
  if (uVar17 == 0xe) {
    TVar7 = p->sampler;
  }
  else {
    TVar7 = (TSampler)((uint)this->sampler & 0x80000000 | 0x1f000000);
  }
  this->sampler = TVar7;
  pTVar19 = &p->qualifier;
  pTVar20 = &this->qualifier;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    pTVar20->semanticName = pTVar19->semanticName;
    pTVar19 = (TQualifier *)&pTVar19->field_0x8;
    pTVar20 = (TQualifier *)&pTVar20->field_0x8;
  }
  pTVar21 = p->userDef;
  local_28.allocator = in_RAX;
  if (pTVar21 != (TType *)0x0) {
    if (pTVar21->field_0x8 == '\x12') {
      *(uint *)&this->field_0x8 =
           uVar16 | uVar9 & 0xf0000000 | uVar12 | uVar13 | uVar14 | uVar15 | uVar10 | 0x12;
      pTVar21 = p->userDef;
    }
    else {
      iVar8 = (*pTVar21->_vptr_TType[0x25])(pTVar21);
      if ((char)iVar8 == '\0') {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
      }
    }
    this->field_13 = pTVar21->field_13;
    iVar8 = (*p->userDef->_vptr_TType[5])();
    __s = *(char **)(CONCAT44(extraout_var,iVar8) + 8);
    this_00 = GetThreadPoolAllocator();
    this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
    local_28.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_01,
               __s,&local_28);
    this->typeName = this_01;
  }
  if (((p->field_0xb9 & 0x10) != 0) && (p->typeParameters != (TTypeParameters *)0x0)) {
    pTVar3 = p->typeParameters->arraySizes;
    pTVar4 = (pTVar3->sizes).sizes;
    if ((pTVar4 != (TVector<glslang::TArraySize> *)0x0) &&
       (0 < (int)((ulong)((long)(pTVar4->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar4->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      uVar9 = TSmallArrayVector::getDimSize(&pTVar3->sizes,0);
      TVar2 = p->basicType;
      uVar17 = uVar9 ^ 0x10;
      uVar18 = 3;
      if (TVar2 != EbtFloat || uVar17 != 0) {
        uVar18 = 5;
        if (((uVar9 ^ 8) != 0 || (TVar2 ^ EbtUint) != EbtVoid) &&
           (uVar18 = 7, (TVar2 ^ EbtUint) != EbtVoid || uVar17 != 0)) {
          uVar18 = 4;
          if (((uVar9 ^ 8) != 0 || (TVar2 ^ EbtInt) != EbtVoid) &&
             (uVar18 = 6, uVar17 != 0 || (TVar2 ^ EbtInt) != EbtVoid)) goto LAB_004c64af;
        }
      }
      this->field_0x8 = uVar18;
      puVar1 = &(this->qualifier).field_0xb;
      *puVar1 = *puVar1 & 0xf1;
    }
  }
LAB_004c64af:
  if (((((p->field_0xb9 & 0x20) != 0) &&
       (pTVar5 = p->typeParameters, pTVar5 != (TTypeParameters *)0x0)) &&
      (pTVar4 = (pTVar5->arraySizes->sizes).sizes, pTVar4 != (TVector<glslang::TArraySize> *)0x0))
     && (0 < (int)((ulong)((long)(pTVar4->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar4->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    this->field_0x8 = (char)pTVar5->basicType;
    iVar8 = (*this->_vptr_TType[7])(this);
    if (iVar8 == 0x1a) {
      pTVar6 = p->typeParameters->spirvType;
      if (pTVar6 == (TSpirvType *)0x0) {
        __assert_fail("p.typeParameters->spirvType",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x65d,"glslang::TType::TType(const TPublicType &)");
      }
      this->spirvType = pTVar6;
    }
    pTVar3 = p->typeParameters->arraySizes;
    pTVar4 = (pTVar3->sizes).sizes;
    if ((pTVar4 != (TVector<glslang::TArraySize> *)0x0) &&
       (((long)(pTVar4->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pTVar4->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) == 0x40)) {
      uVar9 = TSmallArrayVector::getDimSize(&pTVar3->sizes,3);
      if ((int)uVar9 < 0) {
        __assert_fail("dimSize >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x663,"glslang::TType::TType(const TPublicType &)");
      }
      *(uint *)&this->field_0x8 =
           (uVar9 & 7) * 0x800000 + (*(uint *)&this->field_0x8 & 0xf87fffff) + 0x4000000;
    }
  }
  if (((p->field_0xb9 & 0x40) != 0) && (p->typeParameters != (TTypeParameters *)0x0)) {
    this->field_0x8 = (char)p->typeParameters->basicType;
  }
  return;
}

Assistant:

explicit TType(const TPublicType& p) :
                            basicType(p.basicType),
                            vectorSize(p.vectorSize), matrixCols(p.matrixCols), matrixRows(p.matrixRows), vector1(false), coopmatNV(p.coopmatNV), coopmatKHR(p.coopmatKHR), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(p.coopvecNV),
                            arraySizes(p.arraySizes), structure(nullptr), fieldName(nullptr), typeName(nullptr), typeParameters(p.typeParameters),
                            spirvType(p.spirvType)
                            {
                                if (basicType == EbtSampler)
                                    sampler = p.sampler;
                                else
                                    sampler.clear();
                                qualifier = p.qualifier;
                                if (p.userDef) {
                                    if (p.userDef->basicType == EbtReference) {
                                        basicType = EbtReference;
                                        referentType = p.userDef->referentType;
                                    } else {
                                        structure = p.userDef->getWritableStruct();  // public type is short-lived; there are no sharing issues
                                    }
                                    typeName = NewPoolTString(p.userDef->getTypeName().c_str());
                                }
                                if (p.isCoopmatNV() && p.typeParameters && p.typeParameters->arraySizes->getNumDims() > 0) {
                                    int numBits = p.typeParameters->arraySizes->getDimSize(0);
                                    if (p.basicType == EbtFloat && numBits == 16) {
                                        basicType = EbtFloat16;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtUint && numBits == 8) {
                                        basicType = EbtUint8;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtUint && numBits == 16) {
                                        basicType = EbtUint16;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtInt && numBits == 8) {
                                        basicType = EbtInt8;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtInt && numBits == 16) {
                                        basicType = EbtInt16;
                                        qualifier.precision = EpqNone;
                                    }
                                }
                                if (p.isCoopmatKHR() && p.typeParameters && p.typeParameters->arraySizes->getNumDims() > 0) {
                                    basicType = p.typeParameters->basicType;
                                    if (isSpirvType()) {
                                        assert(p.typeParameters->spirvType);
                                        spirvType = p.typeParameters->spirvType;
                                    }

                                    if (p.typeParameters->arraySizes->getNumDims() == 4) {
                                        const int dimSize = p.typeParameters->arraySizes->getDimSize(3);
                                        assert(dimSize >= 0);
                                        coopmatKHRuse = static_cast<uint32_t>(dimSize) & 0b111;
                                        coopmatKHRUseValid = true;
                                    }
                                }
                                if (p.isCoopvecNV() && p.typeParameters) {
                                    basicType = p.typeParameters->basicType;
                                }
                            }